

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O1

int pr_psupp(part_t *part,int mode)

{
  FILE *pFVar1;
  int in_ECX;
  char *__s;
  int in_R8D;
  long lVar2;
  
  if (pr_psupp::ps_fp == (FILE *)0x0) {
    pr_psupp::ps_fp = print_prep(1,mode);
  }
  __s = part->s[0].comment;
  lVar2 = 4;
  do {
    pFVar1 = pr_psupp::ps_fp;
    fprintf((FILE *)pr_psupp::ps_fp,"%ld",((partsupp_t *)(__s + -0x20))->partkey);
    fputc(0x7c,(FILE *)pFVar1);
    pFVar1 = pr_psupp::ps_fp;
    fprintf((FILE *)pr_psupp::ps_fp,"%ld",*(long *)(__s + -0x18));
    fputc(0x7c,(FILE *)pFVar1);
    pFVar1 = pr_psupp::ps_fp;
    fprintf((FILE *)pr_psupp::ps_fp,"%ld",*(long *)(__s + -0x10));
    fputc(0x7c,(FILE *)pFVar1);
    dbg_print(5,pr_psupp::ps_fp,__s + -8,in_ECX,in_R8D);
    pFVar1 = pr_psupp::ps_fp;
    fputs(__s,(FILE *)pr_psupp::ps_fp);
    fputc(0x7c,(FILE *)pFVar1);
    fputc(10,(FILE *)pr_psupp::ps_fp);
    __s = __s + 0xf0;
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  return 0;
}

Assistant:

int
pr_psupp(part_t *part, int mode)
{
    static FILE *ps_fp = NULL;
    long      i;

    if (ps_fp == NULL)
        ps_fp = print_prep(PSUPP, mode);

   for (i = 0; i < SUPP_PER_PART; i++)
      {
      PR_STRT(ps_fp);
      PR_HUGE(ps_fp, &part->s[i].partkey);
      PR_HUGE(ps_fp, &part->s[i].suppkey);
      PR_HUGE(ps_fp, &part->s[i].qty);
      PR_MONEY(ps_fp, &part->s[i].scost);
      PR_VSTR_LAST(ps_fp, part->s[i].comment,part->s[i].clen);
      PR_END(ps_fp);
      }

   return(0);
}